

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

void __thiscall Interface::Run(Interface *this)

{
  lock_guard<std::mutex> local_48;
  LockGuardType guard;
  string local_30 [8];
  string sInputLine;
  Interface *this_local;
  
  std::ios_base::setf((ios_base *)(this->m_Out + *(long *)(*(long *)this->m_Out + -0x18)),_S_unitbuf
                     );
  std::__cxx11::string::string(local_30);
  RegisterAll(this);
  AnnounceSelf(this);
  while ((this->m_bIsRunning & 1U) != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>(this->m_In,local_30);
    if ((this->m_bLogInputToFile & 1U) != 0) {
      LogLineToFile(this,(string *)local_30);
    }
    std::lock_guard<std::mutex>::lock_guard(&local_48,&this->m_Lock);
    Execute(this,(string *)local_30);
    std::lock_guard<std::mutex>::~lock_guard(&local_48);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Run()
    {
        m_Out->setf( ios::unitbuf );
        string sInputLine;
        RegisterAll();

        AnnounceSelf();

        while ( m_bIsRunning )
        {
            getline( *m_In, sInputLine );
            if ( m_bLogInputToFile )
                LogLineToFile( sInputLine );

            LockGuardType guard( m_Lock );
            Execute( sInputLine );
        }
    }